

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.cc
# Opt level: O3

CordRepCrc * absl::lts_20250127::cord_internal::CordRepCrc::New(CordRep *child,CrcCordState *state)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  CordRepCrc *pCVar3;
  size_t sVar4;
  CordRep *pCVar5;
  
  if (child == (CordRep *)0x0) {
    pCVar5 = (CordRep *)0x0;
  }
  else {
    pCVar5 = child;
    if (child->tag == '\x02') {
      if ((child->refcount).count_.super___atomic_base<int>._M_i == 2) {
        if ((child->tag == '\x02') &&
           (crc_internal::CrcCordState::operator=((CrcCordState *)&child[1].refcount,state),
           child->tag == '\x02')) {
          return (CordRepCrc *)child;
        }
      }
      else if (child->tag == '\x02') {
        pCVar5 = (CordRep *)child[1].length;
        if (pCVar5 == (CordRep *)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        (pCVar5->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar5->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        LOCK();
        pRVar1 = &child->refcount;
        uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + -2;
        UNLOCK();
        if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
          __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0xac,
                        "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()")
          ;
        }
        if (uVar2 == 2) {
          CordRep::Destroy(child);
        }
        goto LAB_0033358a;
      }
      __assert_fail("IsCrc()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                    ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
    }
  }
LAB_0033358a:
  pCVar3 = (CordRepCrc *)operator_new(0x20);
  (pCVar3->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  crc_internal::CrcCordState::CrcCordState(&pCVar3->crc_cord_state);
  if (pCVar5 == (CordRep *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = pCVar5->length;
  }
  (pCVar3->super_CordRep).length = sVar4;
  (pCVar3->super_CordRep).tag = '\x02';
  pCVar3->child = pCVar5;
  crc_internal::CrcCordState::operator=(&pCVar3->crc_cord_state,state);
  return pCVar3;
}

Assistant:

CordRepCrc* CordRepCrc::New(CordRep* child, crc_internal::CrcCordState state) {
  if (child != nullptr && child->IsCrc()) {
    if (child->refcount.IsOne()) {
      child->crc()->crc_cord_state = std::move(state);
      return child->crc();
    }
    CordRep* old = child;
    child = old->crc()->child;
    CordRep::Ref(child);
    CordRep::Unref(old);
  }
  auto* new_cordrep = new CordRepCrc;
  new_cordrep->length = child != nullptr ? child->length : 0;
  new_cordrep->tag = cord_internal::CRC;
  new_cordrep->child = child;
  new_cordrep->crc_cord_state = std::move(state);
  return new_cordrep;
}